

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTCue_GetProperties(FACTCue *pCue,FACTCueInstanceProperties **ppProperties)

{
  uint32_t uVar1;
  long lVar2;
  undefined2 *puVar3;
  long *in_RSI;
  undefined8 *in_RDI;
  FACTWaveInstanceProperties waveProps;
  FACTSoundProperties *sndProps;
  FACTVariationProperties *varProps;
  FACTCueInstanceProperties *cueProps;
  size_t allocSize;
  uint32_t i;
  FACTWave *in_stack_ffffffffffffff68;
  FACTCueProperties *in_stack_ffffffffffffff78;
  uint16_t in_stack_ffffffffffffff86;
  FACTSoundBank *in_stack_ffffffffffffff88;
  uint local_58;
  uint local_54;
  long local_28;
  uint local_1c;
  uint32_t local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x11709c);
    local_28 = 0x13c;
    if (in_RDI[9] != 0) {
      local_28 = (ulong)*(byte *)(*(long *)in_RDI[9] + 0xb) * 0xc + 0x13c;
    }
    lVar2 = (**(code **)(*(long *)*in_RDI + 200))(local_28);
    SDL_memset(lVar2,0,local_28);
    FACTSoundBank_GetCueProperties
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff86,in_stack_ffffffffffffff78);
    if (in_RDI[10] != 0) {
      *(undefined2 *)(lVar2 + 0x110) = 0;
      *(char *)(lVar2 + 0x112) =
           (char)(int)(*(float *)(in_RDI[10] + 8) - *(float *)(in_RDI[10] + 4));
      if (*(char *)in_RDI[5] == '\x03') {
        *(undefined4 *)(lVar2 + 0x114) = *(undefined4 *)(in_RDI[10] + 4);
        *(undefined4 *)(lVar2 + 0x118) = *(undefined4 *)(in_RDI[10] + 8);
      }
      else {
        *(undefined4 *)(lVar2 + 0x114) = 0;
        *(undefined4 *)(lVar2 + 0x118) = 0;
      }
      *(undefined4 *)(lVar2 + 0x11c) = *(undefined4 *)(in_RDI[10] + 0xc);
    }
    puVar3 = (undefined2 *)(lVar2 + 0x120);
    if (in_RDI[9] != 0) {
      *puVar3 = *(undefined2 *)(*(long *)in_RDI[9] + 2);
      *(undefined1 *)(lVar2 + 0x122) = *(undefined1 *)(*(long *)in_RDI[9] + 10);
      *(undefined2 *)(lVar2 + 0x124) = *(undefined2 *)(*(long *)in_RDI[9] + 8);
      *(undefined4 *)(lVar2 + 0x128) = *(undefined4 *)(*(long *)in_RDI[9] + 4);
      *(ushort *)(lVar2 + 300) = (ushort)*(byte *)(*(long *)in_RDI[9] + 0xb);
      for (local_1c = 0; local_1c < *(ushort *)(lVar2 + 300); local_1c = local_1c + 1) {
        uVar1 = FACTWave_GetProperties
                          (in_stack_ffffffffffffff68,(FACTWaveInstanceProperties *)0x1172fa);
        if (uVar1 == 0) {
          *(int *)(lVar2 + 0x130 + (ulong)local_1c * 0xc) =
               (int)(long)(((float)local_54 / (float)(local_58 >> 5 & 0x3ffff)) / 1000.0);
          puVar3[(ulong)local_1c * 6 + 10] = 1;
          *(byte *)(puVar3 + (ulong)local_1c * 6 + 0xb) = (byte)(local_58 >> 2) & 7;
          puVar3[(ulong)local_1c * 6 + 0xc] = 0;
          *(undefined1 *)(puVar3 + (ulong)local_1c * 6 + 0xd) =
               *(undefined1 *)
                (*(long *)(*(long *)(in_RDI[9] + 8) + (ulong)local_1c * 0x68 + 0x58) + 9);
        }
      }
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x117407);
    *in_RSI = lVar2;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FACTCue_GetProperties(
	FACTCue *pCue,
	FACTCueInstanceProperties **ppProperties
) {
	uint32_t i;
	size_t allocSize;
	FACTCueInstanceProperties *cueProps;
	FACTVariationProperties *varProps;
	FACTSoundProperties *sndProps;
	FACTWaveInstanceProperties waveProps;
	if (pCue == NULL)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);

	/* Alloc container (including variable length array space) */
	allocSize = sizeof(FACTCueInstanceProperties);
	if (pCue->playingSound != NULL)
	{
		allocSize += (
			sizeof(FACTTrackProperties) *
			pCue->playingSound->sound->trackCount
		);
	}
	cueProps = (FACTCueInstanceProperties*) pCue->parentBank->parentEngine->pMalloc(
		allocSize
	);
	FAudio_zero(cueProps, allocSize);

	/* Cue Properties */
	FACTSoundBank_GetCueProperties(
		pCue->parentBank,
		pCue->index,
		&cueProps->cueProperties
	);

	/* Variation Properties */
	varProps = &cueProps->activeVariationProperties.variationProperties;
	if (pCue->playingVariation != NULL)
	{
		varProps->index = 0; /* TODO: Index of what...? */
		/* TODO: This is just max - min right? Also why u8 wtf */
		varProps->weight = (uint8_t) (
			pCue->playingVariation->maxWeight -
			pCue->playingVariation->minWeight
		);
		if (pCue->variation->flags == 3)
		{
			varProps->iaVariableMin =
				pCue->playingVariation->minWeight;
			varProps->iaVariableMax =
				pCue->playingVariation->maxWeight;
		}
		else
		{
			varProps->iaVariableMin = 0;
			varProps->iaVariableMax = 0;
		}
		varProps->linger = pCue->playingVariation->linger;
	}

	/* Sound Properties */
	sndProps = &cueProps->activeVariationProperties.soundProperties;
	if (pCue->playingSound != NULL)
	{
		sndProps->category = pCue->playingSound->sound->category;
		sndProps->priority = pCue->playingSound->sound->priority;
		sndProps->pitch = pCue->playingSound->sound->pitch;
		sndProps->volume = pCue->playingSound->sound->volume;
		sndProps->numTracks = pCue->playingSound->sound->trackCount;

		for (i = 0; i < sndProps->numTracks; i += 1)
		{
			if (FACTWave_GetProperties(
				pCue->playingSound->tracks[i].activeWave.wave,
				&waveProps
			) == 0) {
				sndProps->arrTrackProperties[i].duration = (uint32_t) (
					(
						(float) waveProps.properties.durationInSamples /
						(float) waveProps.properties.format.nSamplesPerSec
					) / 1000.0f
				);
				sndProps->arrTrackProperties[i].numVariations = 1; /* ? */
				sndProps->arrTrackProperties[i].numChannels =
					waveProps.properties.format.nChannels;
				sndProps->arrTrackProperties[i].waveVariation = 0; /* ? */
				sndProps->arrTrackProperties[i].loopCount =
					pCue->playingSound->tracks[i].waveEvt->wave.loopCount;
			}
		}
	}

	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);

	*ppProperties = cueProps;
	return 0;
}